

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_cmn.c
# Opt level: O0

void isobusfs_cmn_dump_last_x_bytes(uint8_t *buffer,size_t buffer_size,size_t x)

{
  char *__s;
  int iVar1;
  size_t __maxlen;
  ushort **ppuVar2;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  size_t i;
  int j;
  int n;
  char output [80];
  int remaining;
  uchar c;
  char *output_ptr;
  size_t start_offset;
  uint local_b4;
  ulong local_98;
  int local_90;
  int local_8c;
  char local_88 [88];
  int local_30;
  byte local_29;
  char *local_28;
  ulong local_20;
  ulong local_10;
  long local_8;
  
  local_20 = 0;
  if ((in_RDX != 0) && (in_RDX < in_RSI)) {
    local_20 = in_RSI - in_RDX & 0xfffffffffffffff8;
  }
  local_98 = local_20;
  local_10 = in_RSI;
  local_8 = in_RDI;
  do {
    if (local_10 <= local_98) {
      return;
    }
    local_28 = local_88;
    local_30 = 0x50;
    iVar1 = snprintf(local_28,0x50,"%08lx: ",local_20 + local_98);
    if (iVar1 < 0) {
      return;
    }
    if (local_30 <= iVar1) {
      return;
    }
    local_28 = local_28 + iVar1;
    local_30 = local_30 - iVar1;
    local_90 = 0;
    while (((local_90 < 8 && local_98 + (long)local_90 < local_10 &&
            (iVar1 = snprintf(local_28,(long)local_30,"%02x ",
                              (ulong)*(byte *)(local_8 + local_98 + (long)local_90)), -1 < iVar1))
           && (iVar1 < local_30))) {
      local_28 = local_28 + iVar1;
      local_30 = local_30 - iVar1;
      local_90 = local_90 + 1;
    }
    local_90 = (int)local_10 - (int)local_98;
    while (((local_90 < 8 && (iVar1 = snprintf(local_28,(long)local_30,"   "), -1 < iVar1)) &&
           (iVar1 < local_30))) {
      local_28 = local_28 + iVar1;
      local_30 = local_30 - iVar1;
      local_90 = local_90 + 1;
    }
    local_8c = snprintf(local_28,(long)local_30,"  ");
    if (local_8c < 0) {
      return;
    }
    if (local_30 <= local_8c) {
      return;
    }
    local_28 = local_28 + local_8c;
    local_30 = local_30 - local_8c;
    for (local_90 = 0; __s = local_28, local_90 < 8 && local_98 + (long)local_90 < local_10;
        local_90 = local_90 + 1) {
      local_29 = *(byte *)(local_8 + local_98 + (long)local_90);
      __maxlen = (size_t)local_30;
      ppuVar2 = __ctype_b_loc();
      if (((*ppuVar2)[(int)(uint)local_29] & 0x4000) == 0) {
        local_b4 = 0x2e;
      }
      else {
        local_b4 = (uint)local_29;
      }
      local_8c = snprintf(__s,__maxlen,"%c",(ulong)local_b4);
      if ((local_8c < 0) || (local_30 <= local_8c)) break;
      local_28 = local_28 + local_8c;
      local_30 = local_30 - local_8c;
    }
    isobusfs_log(LOG_LEVEL_DEBUG,"%s",local_88);
    if (local_8c < 0) {
      return;
    }
    if (local_30 <= local_8c) {
      return;
    }
    local_98 = local_98 + 8;
  } while( true );
}

Assistant:

void isobusfs_cmn_dump_last_x_bytes(const uint8_t *buffer, size_t buffer_size,
				    size_t x)
{
	size_t start_offset = 0;
	char *output_ptr;
	unsigned char c;
	int remaining;
	char output[80];
	int n, j;

	if (x > 0 && x < buffer_size)
		start_offset = (buffer_size - x) & ~0x7;

	for (size_t i = start_offset; i < buffer_size; i += 8) {
		output_ptr = output;
		remaining = (int)sizeof(output);

		n = snprintf(output_ptr, remaining, "%08lx: ",
			     (unsigned long)(start_offset + i));
		if (n < 0 || n >= remaining)
			break;

		output_ptr += n;
		remaining -= n;

		for (j = 0; j < 8 && i + j < buffer_size; ++j) {
			n = snprintf(output_ptr, remaining, "%02x ", buffer[i+j]);
			if (n < 0 || n >= remaining)
				break;

			output_ptr += n;
			remaining -= n;
		}

		for (j = buffer_size - i; j < 8; ++j) {
			n = snprintf(output_ptr, remaining, "   ");
			if (n < 0 || n >= remaining)
				break;

			output_ptr += n;
			remaining -= n;
		}

		n = snprintf(output_ptr, remaining, "  ");
		if (n < 0 || n >= remaining)
			break;

		output_ptr += n;
		remaining -= n;

		for (j = 0; j < 8 && i + j < buffer_size; ++j) {
			c = buffer[i+j];
			n = snprintf(output_ptr, remaining, "%c",
				     isprint(c) ? c : '.');
			if (n < 0 || n >= remaining)
				break;

			output_ptr += n;
			remaining -= n;
		}

		pr_debug("%s", output);
		if (n < 0 || n >= remaining)
			break;
	}
}